

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,Indent indent)

{
  cmScriptGeneratorIndent *this_00;
  cmScriptGeneratorIndent cVar1;
  ostream *poVar2;
  char *permissions_file;
  char *files_var;
  string local_100;
  undefined1 local_e0 [8];
  string depNameVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [2];
  string local_88;
  undefined1 local_68 [8];
  string depName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *evaluatedRPaths_local;
  string *config_local;
  ostream *os_local;
  cmInstallRuntimeDependencySetGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar2 = std::operator<<(poVar2,"if(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n");
  this_00 = (cmScriptGeneratorIndent *)((long)&this_local + 4);
  cVar1 = cmScriptGeneratorIndent::Next(this_00,2);
  poVar2 = ::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"set(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_dir \"${CMAKE_MATCH_1}\")\n");
  cVar1 = cmScriptGeneratorIndent::Next(this_00,2);
  poVar2 = ::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"set(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_name \"${CMAKE_MATCH_2}\")\n");
  cVar1 = cmScriptGeneratorIndent::Next(this_00,2);
  poVar2 = ::operator<<(poVar2,cVar1);
  poVar2 = std::operator<<(poVar2,"set(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_file \"${CMAKE_MATCH_3}\")\n");
  depName.field_2._12_4_ = cmScriptGeneratorIndent::Next(this_00,2);
  poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)depName.field_2._12_4_);
  poVar2 = std::operator<<(poVar2,"set(");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_path \"${");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  poVar2 = std::operator<<(poVar2,"_dir}${");
  poVar2 = std::operator<<(poVar2,this->TmpVarPrefix);
  std::operator<<(poVar2,"_name}\")\n");
  cmStrCat<char_const*&,char_const(&)[6]>
            ((string *)local_68,&this->TmpVarPrefix,(char (*) [6])0x124fcdd);
  GetDestination(&local_88,this,config);
  local_b8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_b8);
  permissions_file = (char *)std::__cxx11::string::c_str();
  depNameVar.field_2._12_4_ =
       cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  files_var = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,&local_88,cmInstallType_DIRECTORY,local_b8,false,
             permissions_file,(char *)0x0,(char *)0x0," USE_SOURCE_PERMISSIONS",
             (Indent)depNameVar.field_2._12_4_,files_var);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_b8);
  std::__cxx11::string::~string((string *)&local_88);
  cmStrCat<char_const(&)[3],char_const*&,char_const(&)[10],char_const*&,char_const(&)[7]>
            ((string *)local_e0,(char (*) [3])0x12873d5,&this->TmpVarPrefix,
             (char (*) [10])"_name}/${",&this->TmpVarPrefix,(char (*) [7])0x1278b4c);
  cmStrCat<char_const(&)[3],char_const*&,char_const(&)[6]>
            (&local_100,(char (*) [3])0x12873d5,&this->TmpVarPrefix,(char (*) [6])"_dep}");
  cVar1 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  GenerateInstallNameFixup
            (this,os,config,evaluatedRPaths,&local_100,(string *)local_e0,(Indent)cVar1.Level);
  std::__cxx11::string::~string((string *)&local_100);
  poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar2,"endif()\n");
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateAppleFrameworkScript(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, Indent indent)
{
  os << indent << "if(" << this->TmpVarPrefix
     << "_dep MATCHES \"^(.*/)?([^/]*\\\\.framework)/(.*)$\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_dir \"${CMAKE_MATCH_1}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_name \"${CMAKE_MATCH_2}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix
     << "_file \"${CMAKE_MATCH_3}\")\n"
     << indent.Next() << "set(" << this->TmpVarPrefix << "_path \"${"
     << this->TmpVarPrefix << "_dir}${" << this->TmpVarPrefix << "_name}\")\n";

  auto depName = cmStrCat(this->TmpVarPrefix, "_path");
  this->AddInstallRule(
    os, this->GetDestination(config), cmInstallType_DIRECTORY, {}, false,
    this->Permissions.c_str(), nullptr, nullptr, " USE_SOURCE_PERMISSIONS",
    indent.Next(), depName.c_str());

  auto depNameVar = cmStrCat("${", this->TmpVarPrefix, "_name}/${",
                             this->TmpVarPrefix, "_file}");
  this->GenerateInstallNameFixup(os, config, evaluatedRPaths,
                                 cmStrCat("${", this->TmpVarPrefix, "_dep}"),
                                 depNameVar, indent.Next());

  os << indent << "endif()\n";
}